

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O2

mfb_update_state mfb_update_ex(mfb_window *window,void *buffer,uint width,uint height)

{
  mfb_update_state mVar1;
  
  if (window != (mfb_window *)0x0) {
    if (window[0x2a2] == (mfb_window)0x1) {
      destroy_window_data((SWindowData *)window);
      mVar1 = STATE_EXIT;
    }
    else if (buffer == (void *)0x0) {
      mVar1 = STATE_INVALID_BUFFER;
    }
    else {
      if ((*(uint *)(window + 0x78) != width) || (*(uint *)(window + 0x7c) != height)) {
        *(uint *)(window + 0x78) = width;
        *(uint *)(window + 0x80) = width << 2;
        *(uint *)(window + 0x7c) = height;
      }
      redraw_GL((SWindowData *)window,buffer);
      processEvents((SWindowData *)window);
      mVar1 = STATE_OK;
    }
    return mVar1;
  }
  return STATE_INVALID_WINDOW;
}

Assistant:

mfb_update_state 
mfb_update_ex(struct mfb_window *window, void *buffer, unsigned width, unsigned height) {
    if (window == 0x0) {
        return STATE_INVALID_WINDOW;
    }

    SWindowData *window_data = (SWindowData *) window;
    if (window_data->close) {
        destroy_window_data(window_data);
        return STATE_EXIT;
    }

    if (buffer == 0x0) {
        return STATE_INVALID_BUFFER;
    }

#if !defined(USE_OPENGL_API)
    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
    bool different_size = false;
#endif

    if(window_data->buffer_width != width || window_data->buffer_height != height) {
        window_data->buffer_width  = width;
        window_data->buffer_stride = width * 4;
        window_data->buffer_height = height;
#if !defined(USE_OPENGL_API)
        different_size = true;
#endif
    }

#if !defined(USE_OPENGL_API)

    if (different_size || window_data->buffer_width != window_data->dst_width || window_data->buffer_height != window_data->dst_height) {
        if (window_data_x11->image_scaler_width != window_data->dst_width || window_data_x11->image_scaler_height != window_data->dst_height) {
            if (window_data_x11->image_scaler != 0x0) {
                window_data_x11->image_scaler->data = 0x0;
                XDestroyImage(window_data_x11->image_scaler);
            }
            if (window_data_x11->image_buffer != 0x0) {
                free(window_data_x11->image_buffer);
                window_data_x11->image_buffer = 0x0;
            }
            int depth = DefaultDepth(window_data_x11->display, window_data_x11->screen);
            window_data_x11->image_buffer = malloc(window_data->dst_width * window_data->dst_height * 4);
            if(window_data_x11->image_buffer == 0x0) {
                return STATE_INTERNAL_ERROR;
            }
            window_data_x11->image_scaler_width  = window_data->dst_width;
            window_data_x11->image_scaler_height = window_data->dst_height;
            window_data_x11->image_scaler = XCreateImage(window_data_x11->display, CopyFromParent, depth, ZPixmap, 0, 0x0, window_data_x11->image_scaler_width, window_data_x11->image_scaler_height, 32, window_data_x11->image_scaler_width * 4);
        }
    }

    if (window_data_x11->image_scaler != 0x0) {
        stretch_image((uint32_t *) buffer, 0, 0, window_data->buffer_width, window_data->buffer_height, window_data->buffer_width, 
                      (uint32_t *) window_data_x11->image_buffer, 0, 0, window_data->dst_width, window_data->dst_height, window_data->dst_width);
        window_data_x11->image_scaler->data = (char *) window_data_x11->image_buffer;
        XPutImage(window_data_x11->display, window_data_x11->window, window_data_x11->gc, window_data_x11->image_scaler, 0, 0, window_data->dst_offset_x, window_data->dst_offset_y, window_data->dst_width, window_data->dst_height);
    }
    else {
        window_data_x11->image->data = (char *) buffer;
        XPutImage(window_data_x11->display, window_data_x11->window, window_data_x11->gc, window_data_x11->image, 0, 0, window_data->dst_offset_x, window_data->dst_offset_y, window_data->dst_width, window_data->dst_height);
    }
    XFlush(window_data_x11->display);

#else

    redraw_GL(window_data, buffer);

#endif

    processEvents(window_data);
    
    return STATE_OK;
}